

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cc
# Opt level: O2

void __thiscall
absl::lts_20240722::flags_internal::FlagRegistry::RegisterFlag
          (FlagRegistry *this,CommandLineFlag *flag,char *filename)

{
  CommandLineFlag *pCVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  size_t sVar5;
  pointer prVar6;
  long lVar7;
  long lVar8;
  string *this_00;
  basic_string_view<char,_std::char_traits<char>_> __args;
  char **args;
  char *pcVar9;
  _Alloc_hider in_stack_fffffffffffffde8;
  size_type local_210;
  char *local_1f8;
  size_t local_1f0;
  FlagRegistryLock registry_lock;
  AlphaNum local_1d0;
  AlphaNum local_1a0;
  undefined1 local_170 [32];
  char *filename_local;
  AlphaNum local_148;
  AlphaNum local_118;
  undefined1 local_e8 [128];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  local_68 [32];
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>::iterator,_bool>
  ins;
  
  this_00 = (string *)&stack0xfffffffffffffde8;
  filename_local = filename;
  if (filename != (char *)0x0) {
    (**(code **)(*(long *)flag + 8))(&local_1d0,flag);
    absl::lts_20240722::flags_internal::GetUsageConfig();
    sVar5 = strlen(filename);
    __args._M_str = filename;
    __args._M_len = sVar5;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0,
                 local_68,__args);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_1d0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    FlagsUsageConfig::~FlagsUsageConfig((FlagsUsageConfig *)local_e8);
    std::__cxx11::string::~string((string *)&local_1d0);
    if (bVar2) {
      local_e8._0_16_ =
           (undefined1  [16])
           NullSafeStringView("Inconsistency between flag object and registration for flag \'");
      local_1d0.piece_ = (string_view)(*(code *)**(undefined8 **)flag)(flag);
      local_1a0.piece_ =
           NullSafeStringView(
                             "\', likely due to duplicate flags or an ODR violation. Relevant files: "
                             );
      (**(code **)(*(long *)flag + 8))(&local_1f8,flag);
      local_118.piece_._M_len = local_1f0;
      local_118.piece_._M_str = local_1f8;
      args = (char **)0x10aeca;
      local_148.piece_ = NullSafeStringView(" and ");
      StrCat<char_const*>((string *)&stack0xfffffffffffffde8,(lts_20240722 *)local_e8,&local_1d0,
                          &local_1a0,&local_118,&local_148,(AlphaNum *)&filename_local,args);
      absl::lts_20240722::flags_internal::ReportUsageError
                (local_210,in_stack_fffffffffffffde8._M_p,1,args);
      goto LAB_0010af12;
    }
  }
  registry_lock.fr_ = this;
  absl::lts_20240722::Mutex::Lock();
  local_e8._0_16_ = (*(code *)**(undefined8 **)flag)(flag);
  local_e8._16_8_ = flag;
  container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
  ::
  emplace<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_0>
            (&ins,(raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
                   *)this,
             (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>
              *)local_e8);
  if (ins.second == false) {
    prVar6 = container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
             ::iterator::operator->(&ins.first);
    pCVar1 = prVar6->second;
    cVar3 = (**(code **)(*(long *)flag + 0x18))(flag);
    cVar4 = (**(code **)(*(long *)pCVar1 + 0x18))(pCVar1);
    if (cVar3 == cVar4) {
      lVar7 = absl::lts_20240722::flags_internal::PrivateHandleAccessor::TypeId(flag);
      lVar8 = absl::lts_20240722::flags_internal::PrivateHandleAccessor::TypeId(pCVar1);
      if (lVar7 == lVar8) {
        cVar3 = (**(code **)(*(long *)pCVar1 + 0x18))(pCVar1);
        if (cVar3 != '\0') goto LAB_0010ae31;
        (**(code **)(*(long *)pCVar1 + 8))(local_e8,pCVar1);
        (**(code **)(*(long *)flag + 8))(&local_1d0,flag);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_e8,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)local_e8);
        if (bVar2) {
          local_e8._0_16_ = (undefined1  [16])NullSafeStringView("Flag \'");
          local_1d0.piece_ = (string_view)(*(code *)**(undefined8 **)flag)(flag);
          local_1a0.piece_ = NullSafeStringView("\' was defined more than once (in files \'");
          (**(code **)(*(long *)pCVar1 + 8))(&local_1f8,pCVar1);
          local_118.piece_._M_len = local_1f0;
          local_118.piece_._M_str = local_1f8;
          local_148.piece_ = NullSafeStringView("\' and \'");
          (**(code **)(*(long *)flag + 8))((AlphaNum *)local_170,flag);
          pcVar9 = "\').";
          StrCat<std::__cxx11::string,char[4]>
                    ((string *)&stack0xfffffffffffffde8,(lts_20240722 *)local_e8,&local_1d0,
                     &local_1a0,&local_118,&local_148,(AlphaNum *)local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\').",
                     (char (*) [4])in_stack_fffffffffffffde8._M_p);
          absl::lts_20240722::flags_internal::ReportUsageError
                    (local_210,in_stack_fffffffffffffde8._M_p,1,pcVar9);
        }
        else {
          local_e8._0_16_ = (undefined1  [16])NullSafeStringView("Something is wrong with flag \'");
          local_1d0.piece_ = (string_view)(*(code *)**(undefined8 **)flag)(flag);
          local_1a0.piece_ = NullSafeStringView("\' in file \'");
          (**(code **)(*(long *)flag + 8))(&local_1f8,flag);
          local_118.piece_._M_len = local_1f0;
          local_118.piece_._M_str = local_1f8;
          local_148.piece_ = NullSafeStringView("\'. One possibility: file \'");
          (**(code **)(*(long *)flag + 8))((AlphaNum *)local_170,flag);
          pcVar9 = 
          "\' is being linked both statically and dynamically into this executable. e.g. some files listed as srcs to a test and also listed as srcs of some shared lib deps of the same test."
          ;
          StrCat<std::__cxx11::string,char[179]>
                    ((string *)&stack0xfffffffffffffde8,(lts_20240722 *)local_e8,&local_1d0,
                     &local_1a0,&local_118,&local_148,(AlphaNum *)local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\' is being linked both statically and dynamically into this executable. e.g. some files listed as srcs to a test and also listed as srcs of some shared lib deps of the same test."
                     ,(char (*) [179])in_stack_fffffffffffffde8._M_p);
          absl::lts_20240722::flags_internal::ReportUsageError
                    (local_210,in_stack_fffffffffffffde8._M_p,1,pcVar9);
        }
      }
      else {
        local_e8._0_16_ = (undefined1  [16])NullSafeStringView("Flag \'");
        local_1d0.piece_ = (string_view)(*(code *)**(undefined8 **)flag)(flag);
        local_1a0.piece_ =
             NullSafeStringView(
                               "\' was defined more than once but with differing types. Defined in files \'"
                               );
        (**(code **)(*(long *)pCVar1 + 8))(&local_1f8,pCVar1);
        local_118.piece_._M_len = local_1f0;
        local_118.piece_._M_str = local_1f8;
        local_148.piece_ = NullSafeStringView("\' and \'");
        (**(code **)(*(long *)flag + 8))((AlphaNum *)local_170,flag);
        pcVar9 = "\'.";
        StrCat<std::__cxx11::string,char[3]>
                  ((string *)&stack0xfffffffffffffde8,(lts_20240722 *)local_e8,&local_1d0,&local_1a0
                   ,&local_118,&local_148,(AlphaNum *)local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\'.",
                   (char (*) [3])in_stack_fffffffffffffde8._M_p);
        absl::lts_20240722::flags_internal::ReportUsageError
                  (local_210,in_stack_fffffffffffffde8._M_p,1,pcVar9);
      }
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
      this_00 = (string *)local_170;
    }
    else {
      local_e8._0_16_ = (undefined1  [16])NullSafeStringView("Retired flag \'");
      local_1d0.piece_ = (string_view)(*(code *)**(undefined8 **)flag)(flag);
      local_1a0.piece_ = NullSafeStringView("\' was defined normally in file \'");
      cVar3 = (**(code **)(*(long *)flag + 0x18))(flag);
      if (cVar3 != '\0') {
        flag = pCVar1;
      }
      (**(code **)(*(long *)flag + 8))(&local_1f8,flag);
      local_118.piece_._M_len = local_1f0;
      local_118.piece_._M_str = local_1f8;
      local_148.piece_ = NullSafeStringView("\'.");
      StrCat<>((string *)&stack0xfffffffffffffde8,(AlphaNum *)local_e8,&local_1d0,&local_1a0,
               &local_118,&local_148);
      absl::lts_20240722::flags_internal::ReportUsageError
                (local_210,in_stack_fffffffffffffde8._M_p,1);
      this_00 = (string *)&stack0xfffffffffffffde8;
    }
LAB_0010af12:
    std::__cxx11::string::~string(this_00);
    std::__cxx11::string::~string((string *)&local_1f8);
    exit(1);
  }
LAB_0010ae31:
  anon_unknown_6::FlagRegistryLock::~FlagRegistryLock(&registry_lock);
  return;
}

Assistant:

void FlagRegistry::RegisterFlag(CommandLineFlag& flag, const char* filename) {
  if (filename != nullptr &&
      flag.Filename() != GetUsageConfig().normalize_filename(filename)) {
    flags_internal::ReportUsageError(
        absl::StrCat(
            "Inconsistency between flag object and registration for flag '",
            flag.Name(),
            "', likely due to duplicate flags or an ODR violation. Relevant "
            "files: ",
            flag.Filename(), " and ", filename),
        true);
    std::exit(1);
  }

  FlagRegistryLock registry_lock(*this);

  std::pair<FlagIterator, bool> ins =
      flags_.insert(FlagMap::value_type(flag.Name(), &flag));
  if (ins.second == false) {  // means the name was already in the map
    CommandLineFlag& old_flag = *ins.first->second;
    if (flag.IsRetired() != old_flag.IsRetired()) {
      // All registrations must agree on the 'retired' flag.
      flags_internal::ReportUsageError(
          absl::StrCat(
              "Retired flag '", flag.Name(), "' was defined normally in file '",
              (flag.IsRetired() ? old_flag.Filename() : flag.Filename()), "'."),
          true);
    } else if (flags_internal::PrivateHandleAccessor::TypeId(flag) !=
               flags_internal::PrivateHandleAccessor::TypeId(old_flag)) {
      flags_internal::ReportUsageError(
          absl::StrCat("Flag '", flag.Name(),
                       "' was defined more than once but with "
                       "differing types. Defined in files '",
                       old_flag.Filename(), "' and '", flag.Filename(), "'."),
          true);
    } else if (old_flag.IsRetired()) {
      return;
    } else if (old_flag.Filename() != flag.Filename()) {
      flags_internal::ReportUsageError(
          absl::StrCat("Flag '", flag.Name(),
                       "' was defined more than once (in files '",
                       old_flag.Filename(), "' and '", flag.Filename(), "')."),
          true);
    } else {
      flags_internal::ReportUsageError(
          absl::StrCat(
              "Something is wrong with flag '", flag.Name(), "' in file '",
              flag.Filename(), "'. One possibility: file '", flag.Filename(),
              "' is being linked both statically and dynamically into this "
              "executable. e.g. some files listed as srcs to a test and also "
              "listed as srcs of some shared lib deps of the same test."),
          true);
    }
    // All cases above are fatal, except for the retired flags.
    std::exit(1);
  }
}